

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O1

Map_HashTable_t * Map_SuperTableCreate(Map_SuperLib_t *pLib)

{
  uint uVar1;
  uint uVar2;
  Map_HashTable_t *pMVar3;
  Map_HashEntry_t **__s;
  uint uVar4;
  int iVar5;
  
  pMVar3 = (Map_HashTable_t *)malloc(0x18);
  pMVar3->pBins = (Map_HashEntry_t **)0x0;
  pMVar3->nBins = 0;
  pMVar3->nEntries = 0;
  pMVar3->mmMan = (Extra_MmFixed_t *)0x0;
  pMVar3->mmMan = pLib->mmEntries;
  uVar4 = 19999;
  while( true ) {
    do {
      uVar1 = uVar4 + 1;
      uVar2 = uVar4 & 1;
      uVar4 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar5 = 5;
    while (uVar1 % (iVar5 - 2U) != 0) {
      uVar2 = iVar5 * iVar5;
      iVar5 = iVar5 + 2;
      if (uVar1 < uVar2) goto LAB_00379956;
    }
  }
LAB_00379956:
  pMVar3->nBins = uVar1;
  __s = (Map_HashEntry_t **)malloc((long)(int)uVar1 << 3);
  pMVar3->pBins = __s;
  memset(__s,0,(long)(int)uVar1 << 3);
  return pMVar3;
}

Assistant:

Map_HashTable_t * Map_SuperTableCreate( Map_SuperLib_t * pLib )
{
    Map_HashTable_t * p;
    // allocate the table
    p = ABC_ALLOC( Map_HashTable_t, 1 );
    memset( p, 0, sizeof(Map_HashTable_t) );
    p->mmMan = pLib->mmEntries;
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(20000);
    p->pBins = ABC_ALLOC( Map_HashEntry_t *, p->nBins );
    memset( p->pBins, 0, sizeof(Map_HashEntry_t *) * p->nBins );
    return p;
}